

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writefile.cpp
# Opt level: O2

void __thiscall WriteFile::Append(WriteFile *this,char *data,size_t writeSize)

{
  size_t __n;
  ulong uVar1;
  
  uVar1 = 0x10000 - this->m_pos;
  __n = writeSize;
  if (uVar1 < writeSize) {
    __n = uVar1;
  }
  memcpy(this->m_buff + this->m_pos,data,__n);
  this->m_pos = this->m_pos + __n;
  if (uVar1 < writeSize) {
    uVar1 = writeSize - __n;
    Flush(this);
    if (0xffff < uVar1) {
      WriteUnbuffered(this,data + __n,uVar1);
      return;
    }
    memcpy(this->m_buff,data + __n,uVar1);
    this->m_pos = uVar1;
  }
  return;
}

Assistant:

void WriteFile::Append(const char * data, size_t writeSize)
{
	// feed as much as possible into the buffer
	size_t nCanWrited = std::min(writeSize, (kWriteFileBufferSize - m_pos));
	memcpy(m_buff + m_pos, data, nCanWrited);
	writeSize -= nCanWrited;
	data += nCanWrited;
	m_pos += nCanWrited;
	if (0 == writeSize)
	{
		return;
	}
	
	// can't feed all data into buffer, need to do write m_fd
	Flush();
	
	// rest data can be writed into m_buff, then write them into m_bufff, else do write m_fd directly
	if (writeSize < kWriteFileBufferSize)
	{
		memcpy(m_buff, data, writeSize);
		m_pos = writeSize;
		return;
	}
	
	WriteUnbuffered(data, writeSize);
}